

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void set_compressed(parser *par)

{
  comp_io_buf *pcVar1;
  
  finalize_source(par);
  if (par->input != (io_buf *)0x0) {
    (*par->input->_vptr_io_buf[3])();
  }
  pcVar1 = (comp_io_buf *)operator_new(0xc0);
  comp_io_buf::comp_io_buf(pcVar1);
  par->input = (io_buf *)pcVar1;
  if (par->output != (io_buf *)0x0) {
    (*par->output->_vptr_io_buf[3])();
  }
  pcVar1 = (comp_io_buf *)operator_new(0xc0);
  comp_io_buf::comp_io_buf(pcVar1);
  par->output = (io_buf *)pcVar1;
  return;
}

Assistant:

void set_compressed(parser* par)
{
  finalize_source(par);
  delete par->input;
  par->input = new comp_io_buf;
  delete par->output;
  par->output = new comp_io_buf;
}